

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::AggregationPS::execute
          (AggregationPS *this,VectorBase<double> *x,VectorBase<double> *y,VectorBase<double> *s,
          VectorBase<double> *r,DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  int iVar1;
  uint uVar2;
  pointer pdVar3;
  Nonzero<double> *pNVar4;
  undefined1 auVar5 [16];
  ostream *poVar6;
  double *pdVar7;
  VarStatus *pVVar8;
  SPxInternalCodeException *this_00;
  int iVar9;
  VarStatus VVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar15;
  undefined1 auVar16 [16];
  allocator local_99;
  VectorBase<double> *local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  string local_50;
  
  iVar9 = this->m_i;
  iVar1 = this->m_old_i;
  if (iVar9 != iVar1) {
    pdVar3 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar1] = pdVar3[iVar9];
    pdVar3 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar1] = pdVar3[iVar9];
    rStatus->data[iVar1] = rStatus->data[iVar9];
  }
  iVar9 = this->m_j;
  iVar1 = this->m_old_j;
  if (iVar9 != iVar1) {
    pdVar3 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar1] = pdVar3[iVar9];
    pdVar3 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar1] = pdVar3[iVar9];
    cStatus->data[iVar1] = cStatus->data[iVar9];
  }
  local_98 = r;
  local_88 = SVectorBase<double>::operator[](&(this->m_row).super_SVectorBase<double>,iVar9);
  pNVar4 = (this->m_row).super_SVectorBase<double>.m_elem;
  iVar9 = -1;
  dVar14 = 0.0;
  for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 0x10) {
    iVar1 = *(int *)((long)&pNVar4->idx + lVar12);
    if (iVar1 != this->m_j) {
      dVar14 = *(double *)((long)&pNVar4->val + lVar12) *
               (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar1];
      iVar9 = iVar1;
    }
  }
  dVar15 = ABS(this->m_rhs);
  auVar16._8_8_ = dVar14;
  auVar16._0_8_ = this->m_rhs;
  if (dVar15 <= ABS(dVar14)) {
    dVar15 = ABS(dVar14);
  }
  local_78 = 1.0;
  if (1.0 <= dVar15) {
    local_78 = dVar15;
  }
  uStack_70 = 0;
  auVar5._8_8_ = local_78;
  auVar5._0_8_ = local_78;
  auVar16 = divpd(auVar16,auVar5);
  dStack_60 = auVar16._8_8_;
  local_68 = auVar16._0_8_ - dStack_60;
  (*(this->super_PostStep)._vptr_PostStep[7])();
  iVar1 = this->m_j;
  pdVar3 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3[iVar1] =
       ((double)(~-(ulong)(ABS(local_68) <= extraout_XMM0_Qa) & (ulong)local_68) * local_78) /
       local_88;
  (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[this->m_i] = this->m_rhs;
  if (isOptimal) {
    local_78 = pdVar3[iVar1] - this->m_lower;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    if (-extraout_XMM0_Qa_00 <= local_78) {
      local_78 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_j] - this->m_upper;
      (*(this->super_PostStep)._vptr_PostStep[6])();
      if (local_78 <= extraout_XMM0_Qa_01) goto LAB_001ef5a4;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "EMAISM: numerical violation after disaggregating variable");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
LAB_001ef5a4:
  uVar2 = (this->m_col).super_SVectorBase<double>.memused;
  pNVar4 = (this->m_col).super_SVectorBase<double>.m_elem;
  pdVar3 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = 0;
  uVar11 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar11 = uVar13;
  }
  dVar14 = 0.0;
  for (; uVar11 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
    iVar1 = *(int *)((long)&pNVar4->idx + uVar13);
    if (iVar1 != this->m_i) {
      dVar14 = dVar14 + *(double *)((long)&pNVar4->val + uVar13) * pdVar3[iVar1];
    }
  }
  pdVar3[this->m_i] = (this->m_obj - dVar14) / local_88;
  (local_98->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[this->m_j] = 0.0;
  pVVar8 = cStatus->data;
  VVar10 = pVVar8[iVar9];
  if ((VVar10 & ~FIXED) == ON_UPPER) {
    local_88 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar9] - this->m_oldupper;
    uStack_80 = 0;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    if (ABS(local_88) <= extraout_XMM0_Qa_02) {
      pVVar8 = cStatus->data;
      VVar10 = pVVar8[iVar9];
      goto LAB_001ef65d;
    }
LAB_001ef69d:
    cStatus->data[iVar9] = BASIC;
    (local_98->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar9] = 0.0;
    local_98 = (VectorBase<double> *)
               ((x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[this->m_j] - this->m_upper);
    uStack_90 = 0;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    iVar9 = this->m_j;
    if (ABS((double)local_98) <= extraout_XMM0_Qa_04) {
      pVVar8 = cStatus->data;
      VVar10 = ON_UPPER;
    }
    else {
      local_98 = (VectorBase<double> *)
                 ((x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar9] - this->m_lower);
      uStack_90 = 0;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      if (extraout_XMM0_Qa_05 < ABS((double)local_98)) {
        local_98 = (VectorBase<double> *)this->m_upper;
        pdVar7 = (double *)infinity();
        if (*pdVar7 <= (double)local_98) {
          local_98 = (VectorBase<double> *)this->m_lower;
          pdVar7 = (double *)infinity();
          if ((double)local_98 <= -*pdVar7) {
            iVar9 = this->m_j;
            pVVar8 = cStatus->data;
            VVar10 = ZERO;
            goto LAB_001ef785;
          }
        }
        this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_50,"XMAISM unexpected basis status in aggregation unsimplifier."
                   ,&local_99);
        SPxInternalCodeException::SPxInternalCodeException(this_00,&local_50);
        __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      iVar9 = this->m_j;
      pVVar8 = cStatus->data;
      VVar10 = ON_LOWER;
    }
  }
  else {
LAB_001ef65d:
    if (VVar10 - ON_LOWER < 2) {
      local_88 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar9] - this->m_oldlower;
      uStack_80 = 0;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      if (extraout_XMM0_Qa_03 < ABS(local_88)) goto LAB_001ef69d;
      pVVar8 = cStatus->data;
    }
    iVar9 = this->m_j;
    VVar10 = BASIC;
  }
LAB_001ef785:
  pVVar8[iVar9] = VVar10;
  rStatus->data[this->m_i] = ON_UPPER;
  return;
}

Assistant:

void SPxMainSM<R>::AggregationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];
   int active_idx = -1;

   assert(m_row.size() == 2);

   for(int k = 0; k < 2; ++k)
   {
      if(m_row.index(k) != m_j)
      {
         active_idx = m_row.index(k);
         val = m_row.value(k) * x[active_idx];
      }
   }

   assert(active_idx >= 0);

   R scale = maxAbs(m_rhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_rhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_rhs;

   if(isOptimal && (LT(x[m_j], m_lower, this->feastol()) || GT(x[m_j], m_upper, this->feastol())))
   {
      SPX_MSG_ERROR(std::cerr << "EMAISM: numerical violation after disaggregating variable" << std::endl;
                   )
   }

   // dual:
   R dualVal = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         dualVal += m_col.value(k) * y[m_col.index(k)];
   }

   z = m_obj - dualVal;

   y[m_i] = z / aij;
   r[m_j] = 0.0;

   // basis:
   if(((cStatus[active_idx] == SPxSolverBase<R>::ON_UPPER
         || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
         && NE(x[active_idx], m_oldupper, this->feastol())) ||
         ((cStatus[active_idx] == SPxSolverBase<R>::ON_LOWER
           || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
          && NE(x[active_idx], m_oldlower, this->feastol())))
   {
      cStatus[active_idx] = SPxSolverBase<R>::BASIC;
      r[active_idx] = 0.0;
      assert(NE(m_upper, m_lower, this->epsilon()));

      if(EQ(x[m_j], m_upper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(EQ(x[m_j], m_lower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(m_upper >= R(infinity) && m_lower <= R(-infinity))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM unexpected basis status in aggregation unsimplifier.");
   }
   else
   {
      cStatus[m_j] = SPxSolverBase<R>::BASIC;
   }

   // sides may not be equal and we always only consider the rhs during aggregation, so set ON_UPPER
   // (in theory and with exact arithmetic setting it to FIXED would be correct)
   rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}